

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O1

string_view __thiscall google::protobuf::internal::MicroString::Get(MicroString *this)

{
  MicroRep *pMVar1;
  size_t sVar2;
  LargeRep *pLVar3;
  string_view sVar4;
  
  if (((ulong)this->rep_ & 2) == 0) {
    if (((ulong)this->rep_ & 1) == 0) {
      pMVar1 = (MicroRep *)inline_head(this);
      sVar2 = inline_size(this);
    }
    else {
      pLVar3 = large_rep(this);
      pMVar1 = (MicroRep *)pLVar3->payload;
      sVar2 = (size_t)pLVar3->size;
    }
  }
  else {
    pMVar1 = micro_rep(this);
    sVar2 = (size_t)pMVar1->size;
    pMVar1 = pMVar1 + 1;
  }
  sVar4._M_str = (char *)pMVar1;
  sVar4._M_len = sVar2;
  return sVar4;
}

Assistant:

absl::string_view Get() const {
    if (is_micro_rep()) {
      return micro_rep()->view();
    } else if (is_inline()) {
      return inline_view();
    } else {
      return large_rep()->view();
    }
  }